

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

bool __thiscall cs::type_id::compare(type_id *this,type_id *id)

{
  type_index *in_RSI;
  type_index *in_RDI;
  type_index *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (in_RSI == in_RDI) {
    local_1 = true;
  }
  else if (in_RDI[1]._M_target == (type_info *)0x0) {
    local_1 = std::type_index::operator==(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    local_1 = in_RDI[1]._M_target == in_RSI[1]._M_target;
  }
  return local_1;
}

Assistant:

inline bool compare(const type_id &id) const
		{
			if (&id == this)
				return true;
			if (type_hash)
				return type_hash == id.type_hash;
			else
				return type_idx == id.type_idx;
		}